

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O3

SelectionFlags __thiscall
QAbstractItemViewPrivate::contiguousSelectionCommand
          (QAbstractItemViewPrivate *this,QModelIndex *index,QEvent *event)

{
  SelectionBehavior SVar1;
  QFlagsStorage<QItemSelectionModel::SelectionFlag> QVar2;
  uint uVar3;
  QFlagsStorage<QItemSelectionModel::SelectionFlag> QVar4;
  
  QVar2.i = (Int)extendedSelectionCommand(this,index,event);
  uVar3 = QVar2.i & 0x1f;
  if (uVar3 < 3) {
    if (uVar3 == 0) {
      if ((event != (QEvent *)0x0) && ((*(ushort *)(event + 8) & 0xfffe) == 2)) {
        return (QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>)
               (QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>)QVar2.i;
      }
      SVar1 = this->selectionBehavior;
      QVar4.i = (uint)(SVar1 == SelectColumns) << 6 | 3;
      QVar2.i = 0x23;
      goto LAB_0053c659;
    }
    if (uVar3 == 1) {
      return (QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>)
             (QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>)QVar2.i;
    }
  }
  else {
    if (uVar3 == 3) {
      return (QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>)
             (QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>)QVar2.i;
    }
    if (uVar3 == 0x12) {
      return (SelectionFlags)(QFlagsStorage<QItemSelectionModel::SelectionFlag>)QVar2.i;
    }
  }
  SVar1 = this->selectionBehavior;
  QVar4.i = (uint)(SVar1 == SelectColumns) << 6 | 0x12;
  QVar2.i = 0x32;
LAB_0053c659:
  if (SVar1 != SelectRows) {
    QVar2.i = QVar4.i;
  }
  return (QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>)
         (QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>)QVar2.i;
}

Assistant:

QItemSelectionModel::SelectionFlags
QAbstractItemViewPrivate::contiguousSelectionCommand(const QModelIndex &index,
                                                     const QEvent *event) const
{
    QItemSelectionModel::SelectionFlags flags = extendedSelectionCommand(index, event);
    const int Mask = QItemSelectionModel::Clear | QItemSelectionModel::Select
                     | QItemSelectionModel::Deselect | QItemSelectionModel::Toggle
                     | QItemSelectionModel::Current;

    switch (flags & Mask) {
    case QItemSelectionModel::Clear:
    case QItemSelectionModel::ClearAndSelect:
    case QItemSelectionModel::SelectCurrent:
        return flags;
    case QItemSelectionModel::NoUpdate:
        if (event &&
            (event->type() == QEvent::MouseButtonPress
             || event->type() == QEvent::MouseButtonRelease))
            return flags;
        return QItemSelectionModel::ClearAndSelect|selectionBehaviorFlags();
    default:
        return QItemSelectionModel::SelectCurrent|selectionBehaviorFlags();
    }
}